

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SudokuImage.cpp
# Opt level: O2

void convertInCoverMatrix
               (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *grid,vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                      *coverMatrix)

{
  pointer pvVar1;
  int iVar2;
  ulong uVar3;
  int column;
  long lVar4;
  long lVar5;
  long lVar6;
  _Bit_iterator __first;
  _Bit_iterator __last;
  bool local_51;
  long local_50;
  long local_48;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_40;
  long local_38;
  
  local_40 = grid;
  iVar2 = createCellConstraints(coverMatrix,0);
  iVar2 = createRowConstraints(coverMatrix,iVar2);
  iVar2 = createColumnConstraints(coverMatrix,iVar2);
  createBoxConstraints(coverMatrix,iVar2);
  lVar6 = 0x18;
  for (local_50 = 1; local_50 != 10; local_50 = local_50 + 1) {
    local_38 = local_50 * 0x18;
    local_48 = lVar6;
    for (lVar4 = 1; lVar4 != 10; lVar4 = lVar4 + 1) {
      uVar3 = (ulong)*(uint *)(*(long *)((long)&(local_40->
                                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                )._M_impl.super__Vector_impl_data._M_start[-1].
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data + local_38) + -4 +
                              lVar4 * 4);
      if (uVar3 != 0) {
        for (lVar5 = 0; lVar5 != 0x168; lVar5 = lVar5 + 0x28) {
          if (uVar3 * 0x28 + -0x28 != lVar5) {
            pvVar1 = (coverMatrix->
                     super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            local_51 = false;
            __first.super__Bit_iterator_base._8_8_ = 0;
            __first.super__Bit_iterator_base._M_p =
                 (_Bit_type *)*(ulong *)((long)pvVar1 + lVar5 + -0x18 + lVar6);
            __last.super__Bit_iterator_base._M_offset =
                 *(undefined4 *)
                  ((long)&(pvVar1->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                          super__Bvector_impl_data + lVar5 + lVar6);
            __last.super__Bit_iterator_base._M_p =
                 (_Bit_type *)*(undefined8 *)((long)pvVar1 + lVar5 + -8 + lVar6);
            __last.super__Bit_iterator_base._12_4_ = 0;
            std::__fill_a1(__first,__last,&local_51);
          }
        }
      }
      lVar6 = lVar6 + 0x168;
    }
    lVar6 = local_48 + 0xca8;
  }
  return;
}

Assistant:

void convertInCoverMatrix(vector<vector<int>> &grid, vector<vector<bool>> &coverMatrix){
    //createCoverMatrix(coverMatrix);
    
    int header = 0;
    header = createCellConstraints(coverMatrix, header);
    header = createRowConstraints(coverMatrix, header);
    header = createColumnConstraints(coverMatrix, header);
    createBoxConstraints(coverMatrix, header);

    // Taking into account the values already entered in Sudoku's grid instance
    for (int row = COVER_START_INDEX; row <= SIZE; row++) {
      for (int column = COVER_START_INDEX; column <= SIZE; column++) {
        int n = grid[row - 1][column - 1];
        if (n != EMPTY_CELL) {
          for (int num = MIN_VALUE; num <= MAX_VALUE; num++) {
            if (num != n) {
                std::fill(coverMatrix[indexInCoverMatrix(row, column, num)].begin(), coverMatrix[indexInCoverMatrix(row, column, num)].end(), false);
            }
          }
        }
      }
    }
}